

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
NEST::NESTcalc::GetS2
          (NESTcalc *this,int Ne,double truthPosX,double truthPosY,double truthPosZ,double smearPosX
          ,double smearPosY,double smearPosZ,double dt,double driftVelocity,uint64_t evtNum,
          double dfield,S2CalculationMode mode,int outputTiming,
          vector<long,_std::allocator<long>_> *wf_time,
          vector<double,_std::allocator<double>_> *wf_amp,
          vector<double,_std::allocator<double>_> *g2_params)

{
  ofstream *poVar1;
  pointer pdVar2;
  pointer pdVar3;
  iterator __position;
  iterator __position_00;
  void *pvVar4;
  bool bVar5;
  undefined4 uVar6;
  uint uVar7;
  undefined1 (*pauVar8) [16];
  RandomGen *pRVar9;
  int64_t iVar10;
  int64_t iVar11;
  RandomGen *this_00;
  vector<double,_std::allocator<double>_> *pvVar12;
  size_t sVar13;
  VDetector *pVVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  pointer pdVar18;
  ulong N0;
  ulong uVar19;
  byte bVar20;
  int iVar21;
  ulong N0_00;
  long lVar22;
  size_type __new_size;
  size_type sVar23;
  uint uVar24;
  int iVar25;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  bool YesGas;
  vector<double,_std::allocator<double>_> AreaTableBot [2];
  double phe;
  vector<double,_std::allocator<double>_> AreaTableTop [2];
  vector<double,_std::allocator<double>_> TimeTable;
  vector<double,_std::allocator<double>_> electronstream;
  double offset;
  photonstream photon_times;
  photonstream photon_emission_times;
  undefined1 local_308 [16];
  double local_2f8;
  double local_2e8;
  uint local_2a8;
  bool local_2a1;
  long local_2a0;
  double local_298;
  double local_290 [3];
  vector<double,_std::allocator<double>_> local_278;
  vector<double,_std::allocator<double>_> vStack_260;
  double local_240;
  double local_238;
  long local_230;
  ulong local_228;
  double local_220;
  double local_218;
  double local_210 [3];
  vector<double,_std::allocator<double>_> local_1f8;
  vector<double,_std::allocator<double>_> vStack_1e0;
  void *local_1c8;
  iterator iStack_1c0;
  double *local_1b8;
  undefined1 local_1a8 [16];
  vector<double,_std::allocator<double>_> local_198;
  int local_17c;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  double local_160;
  vector<long,_std::allocator<long>_> *local_158;
  double local_150;
  void *local_148 [2];
  long local_138;
  photonstream local_130;
  photonstream local_118 [3];
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  long local_a0;
  double local_98;
  double local_90;
  uint64_t local_88;
  ulong local_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pauVar8 = (undefined1 (*) [16])
            (g2_params->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1a8 = *pauVar8;
  local_78 = *(double *)pauVar8[1];
  dStack_70 = *(double *)(pauVar8[1] + 8);
  local_210[0] = *(double *)pauVar8[2];
  pdVar18 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar2 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar26 = *(double *)*pauVar8;
  dVar31 = *(double *)(*pauVar8 + 8);
  local_298 = truthPosX;
  local_290[0] = truthPosY;
  local_290[1] = dt;
  local_210[1] = truthPosZ;
  local_17c = outputTiming;
  local_160 = driftVelocity;
  local_88 = evtNum;
  if (pdVar18 != pdVar2) {
    pauVar8 = (undefined1 (*) [16])
              memset(pdVar18,0,((long)pdVar2 + (-8 - (long)pdVar18) & 0xfffffffffffffff8U) + 8);
    dVar26 = (double)local_1a8._0_8_;
    dVar31 = (double)local_1a8._8_8_;
  }
  uVar7 = (uint)pauVar8;
  if (mode == WaveformWithEtrain) {
    uVar7 = (uint)CONCAT71((int7)((ulong)this->fdetector >> 8),this->fdetector->inGas) ^ 1;
    local_2a8 = uVar7;
  }
  else {
    local_2a8 = 0;
  }
  pvVar12 = &this->ionization;
  local_2f8 = 1.0;
  if (((1.0 <= dfield) &&
      (auVar32._4_4_ = -(uint)(dVar31 <= 0.0), auVar32._0_4_ = -(uint)(dVar26 <= 0.0),
      auVar32._8_4_ = -(uint)(local_78 <= 0.0), auVar32._12_4_ = -(uint)(dStack_70 <= 0.0),
      uVar6 = movmskps(uVar7,auVar32), (char)uVar6 == '\0')) && (0.0 < local_210[0])) {
    local_c8 = 0.0;
    uStack_c0 = 0;
    (*this->fdetector->_vptr_VDetector[6])(local_298,local_290[0],this->fdetector,0);
    (*this->fdetector->_vptr_VDetector[6])(smearPosX,smearPosY,this->fdetector,1);
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,0);
    (*this->fdetector->_vptr_VDetector[6])(this->fdetector,1);
    bVar5 = ValidityTests::nearlyEqual(this->fdetector->g1_gas,1.0,1e-09);
    dVar26 = 1.0;
    if (!bVar5) {
      dVar26 = extraout_XMM0_Qa / extraout_XMM0_Qa_01;
      local_2f8 = extraout_XMM0_Qa_00 / extraout_XMM0_Qa_02;
    }
    local_158 = wf_time;
    local_a8 = pvVar12;
    bVar5 = ValidityTests::nearlyEqual(this->fdetector->g1_gas,0.0,1e-09);
    local_b8 = 0.0;
    if (!bVar5) {
      local_c8 = local_2f8;
      uStack_c0 = 0;
      local_b8 = dVar26;
    }
    uStack_b0 = 0;
    pRVar9 = RandomGen::rndm();
    dVar26 = exp(-dt / this->fdetector->eLife_us);
    local_58 = (double)local_1a8._8_8_;
    dStack_50 = (double)local_1a8._8_8_;
    iVar10 = RandomGen::binom_draw(pRVar9,(long)Ne,dVar26 * (double)local_1a8._8_8_);
    uVar7 = (uint)iVar10;
    local_168 = (double)(int)uVar7;
    if (mode - Waveform < 2) {
      local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vStack_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      vStack_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      vStack_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      vStack_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      vStack_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      vStack_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_1b8 = (double *)0x0;
      local_1c8 = (void *)0x0;
      iStack_1c0._M_current = (double *)0x0;
      uVar24 = uVar7;
      if ((byte)local_2a8 != 0) {
        pRVar9 = RandomGen::rndm();
        dVar26 = exp(-local_290[1] / this->fdetector->eLife_us);
        iVar10 = RandomGen::binom_draw(pRVar9,(long)Ne,dVar26);
        uVar24 = (uint)iVar10;
      }
      std::vector<double,_std::allocator<double>_>::resize
                (&local_198,(long)(int)uVar24,local_290 + 1);
      dVar26 = pow(dfield,0.093452);
      dVar27 = exp(dfield * -8.1651e-05);
      dVar27 = dVar27 * dVar26 * 37.368;
      dVar28 = pow(dfield,-0.24855);
      local_290[2] = exp(dfield / -35.661);
      dVar29 = this->fdetector->E_gas * 1000.0;
      dVar30 = pow(dVar29,3.0);
      dVar26 = dVar27 * 0.01;
      dVar41 = dfield * dfield;
      dVar31 = dVar41;
      if (this->fdetector->inGas == true) {
        dVar27 = pow(dfield,3.0);
        auVar36._8_8_ = dVar27;
        auVar36._0_8_ = dVar41;
        auVar32 = divpd(_DAT_00115d90,auVar36);
        dVar35 = (19097.0 / dfield + 4.265) - auVar32._0_8_;
        dVar28 = auVar32._8_8_;
        dVar27 = dVar26;
      }
      else {
        dVar35 = local_290[2] * 36.85;
        dVar28 = dVar28 * 66.35;
      }
      local_218 = (dVar28 + dVar35 + dVar28 + dVar35) * local_290[1] * 1e-06;
      if (local_218 < 0.0) {
        local_218 = sqrt(local_218);
      }
      else {
        local_218 = SQRT(local_218);
      }
      local_220 = (dVar27 + dVar27) * local_290[1] * 1e-06;
      if (local_220 < 0.0) {
        local_220 = sqrt(local_220);
      }
      else {
        local_220 = SQRT(local_220);
      }
      local_2a1 = true;
      pVVar14 = this->fdetector;
      dVar27 = GetDensity(pVVar14->T_Kelvin,pVVar14->p_bar,&local_2a1,1,pVVar14->molarMass);
      local_290[2] = GetDriftVelocity_MagBoltz
                               (dVar27,dVar27,this->fdetector->E_gas * 1000.0,dVar31,
                                this->fdetector->molarMass);
      dVar27 = 124770000.0 / dVar30 + 19097.0 / dVar29 + 4.265 + -1739700.0 / (dVar29 * dVar29);
      dVar31 = local_210[0] / local_290[2];
      local_238 = (dVar27 + dVar27) * dVar31 * 1e-06;
      if (local_238 < 0.0) {
        local_238 = sqrt(local_238);
      }
      else {
        local_238 = SQRT(local_238);
      }
      local_240 = (dVar26 + dVar26) * dVar31 * 1e-06;
      if (local_240 < 0.0) {
        local_240 = sqrt(local_240);
      }
      else {
        local_240 = SQRT(local_240);
      }
      if ((int)uVar24 < 1) {
        local_2f8 = 1e+100;
        local_178 = 0.0;
        uStack_170 = 0;
        lVar22 = 0;
        local_230 = 0;
        local_228 = 0;
      }
      else {
        local_218 = local_218 * 10.0;
        local_220 = local_220 * 10.0;
        local_238 = local_238 * 10.0;
        local_240 = local_240 * 10.0;
        local_68 = -(5303.0 / dVar41 + 0.28326);
        uStack_60 = 0x8000000000000000;
        local_90 = (local_290[2] * 4.5545e-31 * local_290[2] * 1000000.0) / 1.602e-16;
        local_98 = local_210[0] * 0.5;
        local_a0 = (long)(int)uVar7;
        local_80 = (ulong)uVar24;
        local_2f8 = 1e+100;
        uVar17 = 0;
        local_228 = 0;
        local_230 = 0;
        local_2a0 = 0;
        local_178 = 0.0;
        uStack_170 = 0;
        do {
          pRVar9 = RandomGen::rndm();
          dVar26 = RandomGen::rand_gauss(pRVar9,0.0,local_218,false);
          pRVar9 = RandomGen::rndm();
          local_308._0_8_ = RandomGen::rand_gauss(pRVar9,0.0,local_220,false);
          pRVar9 = RandomGen::rndm();
          dVar31 = RandomGen::rand_uniform(pRVar9);
          local_308._0_8_ = ABS((double)local_308._0_8_);
          dVar27 = cos(dVar31 * 6.283185307179586);
          dVar31 = sin(dVar31 * 6.283185307179586);
          dVar27 = dVar27 * (double)local_308._0_8_ + local_298;
          dVar31 = dVar31 * (double)local_308._0_8_ + local_290[0];
          pVVar14 = this->fdetector;
          if (dVar27 * dVar27 + dVar31 * dVar31 <= pVVar14->radmax * pVVar14->radmax) {
            dVar26 = dVar26 / local_160 + 0.0;
            if ((pVVar14->inGas == false) && ((pVVar14->E_gas != 0.0 || (NAN(pVVar14->E_gas))))) {
              pRVar9 = RandomGen::rndm();
              dVar29 = RandomGen::rand_uniform(pRVar9);
              dVar29 = log(dVar29);
              dVar26 = dVar26 + dVar29 * local_68;
            }
            local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] =
                 dVar26 + local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar17];
            pRVar9 = RandomGen::rndm();
            dVar26 = this->fdetector->s2Fano * local_1a8._0_8_;
            if (dVar26 < 0.0) {
              dVar26 = sqrt(dVar26);
            }
            else {
              dVar26 = SQRT(dVar26);
            }
            dVar26 = RandomGen::rand_gauss
                               (pRVar9,(double)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),dVar26,true
                               );
            dVar26 = floor(dVar26 + 0.5);
            pRVar9 = RandomGen::rndm();
            N0_00 = (long)(dVar26 - 9.223372036854776e+18) & (long)dVar26 >> 0x3f | (long)dVar26;
            iVar10 = RandomGen::binom_draw(pRVar9,N0_00,this->fdetector->g1_gas * local_b8);
            dVar29 = (double)iVar10;
            dVar26 = this->fdetector->TopDrift;
            dVar30 = floor(dVar29 * 0.0566 + 0.5);
            GetPhotonTimes(local_118,this,beta,(int)iVar10,(int)dVar30,dfield,local_90);
            AddPhotonTransportTime(&local_130,this,local_118,dVar27,dVar31,dVar26 + local_98);
            pRVar9 = RandomGen::rndm();
            N0 = (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f | (long)dVar29;
            iVar10 = RandomGen::binom_draw(pRVar9,N0,this->fdetector->P_dphe);
            dVar29 = dVar29 + (double)iVar10;
            local_48 = dVar29 - 9.223372036854776e+18;
            uStack_40 = 0;
            pRVar9 = RandomGen::rndm();
            dVar26 = RandomGen::rand_gauss(pRVar9,0.0,local_238,false);
            pRVar9 = RandomGen::rndm();
            RandomGen::rand_gauss(pRVar9,0.0,local_240,false);
            pRVar9 = RandomGen::rndm();
            dVar31 = RandomGen::rand_uniform(pRVar9);
            cos(dVar31 * 6.283185307179586);
            sin(dVar31 * 6.283185307179586);
            local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] =
                 dVar26 / local_290[2] +
                 local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
            bVar20 = local_a0 <= (long)uVar17 & (byte)local_2a8;
            if (bVar20 == 1) {
              dVar26 = this->fdetector->TopDrift;
              dVar27 = this->fdetector->E_gas / 1.8476719333639615;
              dVar31 = exp(dVar27 * 0.15578);
              dVar27 = exp(dVar27 * 0.21177);
              pRVar9 = RandomGen::rndm();
              dVar30 = RandomGen::rand_uniform(pRVar9);
              if (((dVar27 * 0.38157 * 0.01) / 0.035) * local_58 <= dVar30) {
                pRVar9 = RandomGen::rndm();
                dVar26 = RandomGen::rand_uniform(pRVar9);
                dVar26 = log(dVar26);
                local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17] =
                     dVar31 * 1.4054 * 1000.0 * -0.01 * dVar26 +
                     local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar17];
              }
              else {
                pRVar9 = RandomGen::rndm();
                dVar31 = RandomGen::rand_uniform(pRVar9);
                dVar31 = (dVar26 / local_160) / dVar31;
                dVar26 = 1000000.0;
                if (dVar31 <= 1000000.0) {
                  dVar26 = dVar31;
                }
                local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17] =
                     dVar26 + local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar17];
              }
            }
            if (0.0 < dVar29) {
              local_308 = ZEXT816(0);
              local_2e8 = local_2f8;
              do {
                pRVar9 = RandomGen::rndm();
                this_00 = RandomGen::rndm();
                dVar26 = RandomGen::FindNewMean(this_00,this->fdetector->sPEres);
                local_210[2] = RandomGen::rand_zero_trunc_gauss
                                         (pRVar9,1.0 / dVar26,this->fdetector->sPEres);
                if (bVar20 == 0) {
                  local_178 = local_178 + local_210[2];
                }
                dVar26 = this->fdetector->TopDrift;
                pRVar9 = RandomGen::rndm();
                dVar31 = RandomGen::rand_uniform(pRVar9);
                uVar16 = (long)((double)local_308._0_8_ - 9.223372036854776e+18) &
                         (long)(double)local_308._0_8_ >> 0x3f | (long)(double)local_308._0_8_;
                uVar15 = (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish -
                         (long)local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start >> 3;
                uVar19 = 0;
                if (uVar15 <= uVar16) {
                  uVar19 = uVar15;
                }
                local_2f8 = ((this->fdetector->anode - (dVar31 * local_210[0] + dVar26)) /
                             local_290[2] +
                            local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar17]) * 1000.0 +
                            local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar16 - uVar19];
                local_150 = local_2f8;
                pRVar9 = RandomGen::rndm();
                dVar31 = RandomGen::rand_uniform(pRVar9);
                (*this->fdetector->_vptr_VDetector[7])
                          (local_298,local_290[0],SUB84(local_210[1],0),local_148);
                dVar26 = *(double *)((long)local_148[0] + 8);
                operator_delete(local_148[0],local_138 - (long)local_148[0]);
                if (dVar26 <= dVar31) {
                  local_148[0] = (void *)0x0;
                  if (local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              (&local_278,
                               (iterator)
                               local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(double *)local_148);
                  }
                  else {
                    *local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = 0.0;
                    local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    *local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_210[2];
                    goto LAB_0010cef0;
                  }
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                            ((vector<double,std::allocator<double>> *)&local_1f8,
                             (iterator)
                             local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,local_210 + 2);
                }
                else {
                  if (local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                              ((vector<double,std::allocator<double>> *)&local_278,
                               (iterator)
                               local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,local_210 + 2);
                  }
                  else {
                    *local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_210[2];
                    local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  local_148[0] = (void *)0x0;
                  if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              (&local_1f8,
                               (iterator)
                               local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish,(double *)local_148);
                  }
                  else {
                    *local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = 0.0;
LAB_0010cef0:
                    local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                }
                if (iStack_1c0._M_current == local_1b8) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                            ((vector<double,std::allocator<double>> *)&local_1c8,iStack_1c0,
                             &local_150);
                }
                else {
                  *iStack_1c0._M_current = local_150;
                  iStack_1c0._M_current = iStack_1c0._M_current + 1;
                }
                if (local_2e8 <= local_2f8) {
                  local_2f8 = local_2e8;
                }
                uVar6 = local_308._12_4_;
                dVar26 = (double)local_308._0_8_ + 1.0;
                local_308._8_4_ = local_308._8_4_;
                local_308._0_8_ = dVar26;
                local_308._12_4_ = uVar6;
                local_2e8 = local_2f8;
              } while (dVar26 < dVar29);
            }
            if (local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_130.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_130.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_130.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_118[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_118[0].super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_118[0].super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_228 = local_228 + N0_00;
            local_230 = local_230 + N0;
            local_2a0 = local_2a0 + ((long)local_48 & (long)dVar29 >> 0x3f | (long)dVar29);
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != local_80);
        local_2f8 = local_2f8 + -50.0;
        lVar22 = local_2a0;
      }
      uVar7 = (int)lVar22 * 1000;
      __new_size = 100;
      if (100 < (int)uVar7) {
        __new_size = (size_type)uVar7;
      }
      local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                (&vStack_260,__new_size,(value_type *)local_118);
      local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (double *)0x0;
      std::vector<double,_std::allocator<double>_>::resize
                (&vStack_1e0,__new_size,(value_type *)local_118);
      local_2a0 = lVar22;
      if (lVar22 != 0) {
        uVar7 = (int)__new_size - 1;
        lVar22 = 0;
        do {
          bVar5 = ValidityTests::nearlyEqual
                            (local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar22],0.0,1e-09);
          if (bVar5) {
            (*this->fdetector->_vptr_VDetector[9])
                      (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar22],local_118);
          }
          else {
            (*this->fdetector->_vptr_VDetector[9])
                      (local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar22],local_118);
          }
          pdVar2 = local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          pdVar18 = local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar25 = (int)((ulong)((long)local_118[0].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)local_118[0].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3);
          if (iVar25 < 2) {
            if (local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) goto LAB_0010d2cb;
          }
          else {
            iVar25 = iVar25 + -1;
            iVar21 = 0;
            do {
              dVar26 = *pdVar18;
              bVar5 = ValidityTests::nearlyEqual
                                (local_278.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar22],0.0,1e-09);
              dVar31 = floor((dVar26 + (double)iVar21) / 10.0 + 0.5);
              uVar24 = (int)dVar31;
              if ((int)dVar31 < 1) {
                uVar24 = 0;
              }
              if ((int)uVar7 <= (int)uVar24) {
                uVar24 = uVar7;
              }
              dVar26 = ((dVar26 + (double)iVar21) - *(double *)((long)local_1c8 + lVar22 * 8)) +
                       local_2f8;
              pvVar12 = &local_278;
              if (bVar5) {
                pvVar12 = &local_1f8;
              }
              dVar31 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar22];
              pvVar12 = &vStack_260;
              if (bVar5) {
                pvVar12 = &vStack_1e0;
              }
              dVar26 = exp((dVar26 * dVar26) / -200.0);
              pdVar3 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar3[uVar24] = dVar26 * ((dVar31 * 10.0) / 25.06628274631001) + pdVar3[uVar24];
              iVar21 = iVar21 + 10;
              iVar25 = iVar25 + -1;
            } while (iVar25 != 0);
LAB_0010d2cb:
            operator_delete(pdVar18,(long)pdVar2 - (long)pdVar18);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != local_2a0);
      }
      pdVar18 = (pointer)(long)(local_2f8 + 5.0);
      poVar1 = &this->pulseFile;
      local_308 = ZEXT816(0);
      sVar23 = 0;
      local_2f8 = 0.0;
      do {
        if (0.005 < vStack_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar23] +
                    vStack_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar23]) {
          __position._M_current =
               (local_158->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_158->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = pdVar18;
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<unsigned_long>
                      (local_158,__position,(unsigned_long *)local_118);
          }
          else {
            *__position._M_current = (long)pdVar18;
            (local_158->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(vStack_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar23] +
                        vStack_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar23]);
          __position_00._M_current =
               (wf_amp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (wf_amp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (wf_amp,__position_00,(double *)local_118);
          }
          else {
            *__position_00._M_current =
                 (double)local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (wf_amp->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
          if (-1 < local_17c) {
            dVar26 = vStack_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar23];
            local_308._0_8_ = -(ulong)(140.0 < dVar26) & (ulong)(dVar26 + -140.0);
            dVar31 = vStack_1e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar23];
            local_2f8 = (double)(-(ulong)(140.0 < dVar31) & (ulong)(dVar31 + -140.0));
            local_308._8_8_ = 0;
            snprintf((char *)local_118,0x50,"%llu\t%lld\t%.3f\t%.3f",
                     dVar26 - (double)local_308._0_8_,dVar31 - local_2f8,local_88,
                     (local_158->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish[-1]);
            sVar13 = strlen((char *)local_118);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_118,sVar13);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
            std::ostream::put((char)poVar1);
            std::ostream::flush();
          }
        }
        sVar23 = sVar23 + 1;
        pdVar18 = (pointer)((long)pdVar18 + 10);
      } while (__new_size != sVar23);
      if (local_1c8 != (void *)0x0) {
        operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
      }
      lVar22 = 0x30;
      do {
        pvVar4 = *(void **)((long)local_210 + lVar22);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)local_210 + lVar22 + 0x10) - (long)pvVar4);
        }
        lVar22 = lVar22 + -0x18;
      } while (lVar22 != 0);
      lVar22 = 0x30;
      do {
        pvVar4 = *(void **)((long)local_290 + lVar22);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,*(long *)((long)local_290 + lVar22 + 0x10) - (long)pvVar4);
        }
        lVar22 = lVar22 + -0x18;
      } while (lVar22 != 0);
      if (local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_198.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      pRVar9 = RandomGen::rndm();
      uVar6 = local_1a8._12_4_;
      dVar26 = local_1a8._0_8_ * local_168;
      dVar31 = this->fdetector->s2Fano * local_1a8._0_8_ * local_168;
      if (dVar31 < 0.0) {
        local_1a8._8_4_ = local_1a8._8_4_;
        local_1a8._0_8_ = dVar26;
        local_1a8._12_4_ = uVar6;
        dVar31 = sqrt(dVar31);
        dVar26 = (double)local_1a8._0_8_;
      }
      else {
        dVar31 = SQRT(dVar31);
      }
      dVar26 = RandomGen::rand_gauss(pRVar9,dVar26,dVar31,true);
      dVar26 = floor(dVar26 + 0.5);
      uVar17 = (long)(dVar26 - 9.223372036854776e+18) & (long)dVar26 >> 0x3f | (long)dVar26;
      pRVar9 = RandomGen::rndm();
      local_228 = uVar17;
      iVar10 = RandomGen::binom_draw(pRVar9,uVar17,local_b8 * this->fdetector->g1_gas);
      pRVar9 = RandomGen::rndm();
      iVar11 = RandomGen::binom_draw(pRVar9,iVar10,this->fdetector->P_dphe);
      lVar22 = iVar11 + iVar10;
      local_230 = iVar10;
      pRVar9 = RandomGen::rndm();
      dVar31 = RandomGen::FindNewMean(pRVar9,this->fdetector->sPEres);
      pRVar9 = RandomGen::rndm();
      auVar33._8_4_ = (int)((ulong)lVar22 >> 0x20);
      auVar33._0_8_ = lVar22;
      auVar33._12_4_ = 0x45300000;
      dVar31 = ((auVar33._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar22) - 4503599627370496.0)) / dVar31;
      dVar26 = this->fdetector->sPEres;
      local_2a0 = lVar22;
      if (dVar31 < 0.0) {
        dVar27 = sqrt(dVar31);
      }
      else {
        dVar27 = SQRT(dVar31);
      }
      local_178 = RandomGen::rand_gauss(pRVar9,dVar31,dVar26 * dVar27,true);
      local_2f8 = 0.0;
      local_308._0_8_ = 0.0;
      uStack_170 = extraout_XMM0_Qb;
    }
    pVVar14 = this->fdetector;
    if (1.0 <= pVVar14->noiseLinear[1]) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 " !!WARNING!! S2 linear noise term is greater than or equal to 100% (i.e. 1.0) Did you mistake fraction for percent??"
                 ,0x74);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      pVVar14 = this->fdetector;
    }
    dVar26 = pVVar14->noiseQuadratic[1];
    pRVar9 = RandomGen::rndm();
    pVVar14 = this->fdetector;
    if ((dVar26 != 0.0) || (NAN(dVar26))) {
      dVar26 = pVVar14->noiseQuadratic[1] * local_178 * local_178;
      dVar31 = pVVar14->noiseLinear[1] * local_178;
      dVar26 = SQRT(dVar31 * dVar31 + dVar26 * dVar26);
    }
    else {
      dVar26 = pVVar14->noiseLinear[1] * local_178;
    }
    dVar29 = RandomGen::rand_gauss(pRVar9,local_178,dVar26,true);
    dVar29 = dVar29 - (local_2f8 + (double)local_308._0_8_);
    dVar30 = exp(-local_290[1] / this->fdetector->eLife_us);
    dVar26 = this->fdetector->P_dphe;
    pRVar9 = RandomGen::rndm();
    (*this->fdetector->_vptr_VDetector[7])(local_298,local_290[0],SUB84(local_210[1],0),local_118);
    dVar31 = local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    (*this->fdetector->_vptr_VDetector[7])(local_298,local_290[0],SUB84(local_210[1],0),&local_278);
    dVar27 = local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    (*this->fdetector->_vptr_VDetector[7])(local_298,local_290[0],SUB84(local_210[1],0),&local_1f8);
    pvVar12 = local_a8;
    dVar27 = (1.0 - local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[1]) * dVar27 * dVar29;
    if (dVar27 < 0.0) {
      dVar27 = sqrt(dVar27);
    }
    else {
      dVar27 = SQRT(dVar27);
    }
    dVar31 = RandomGen::rand_gauss(pRVar9,dVar31 * dVar29,dVar27,true);
    if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    dVar27 = exp(-local_290[1] / this->fdetector->eLife_us);
    pdVar18 = (this->ionization).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    *pdVar18 = local_168;
    auVar37._8_4_ = (int)(local_228 >> 0x20);
    auVar37._0_8_ = local_228;
    auVar37._12_4_ = 0x45300000;
    pdVar18[1] = (auVar37._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_228) - 4503599627370496.0);
    auVar38._8_4_ = (int)((ulong)local_230 >> 0x20);
    auVar38._0_8_ = local_230;
    auVar38._12_4_ = 0x45300000;
    pdVar18[2] = (auVar38._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_230) - 4503599627370496.0);
    auVar39._8_4_ = (int)((ulong)local_2a0 >> 0x20);
    auVar39._0_8_ = local_2a0;
    auVar39._12_4_ = 0x45300000;
    pdVar18[3] = (auVar39._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_2a0) - 4503599627370496.0);
    pVVar14 = this->fdetector;
    if (0.0 <= pVVar14->s2_thr) {
      auVar40._0_8_ = dVar29 / dVar30;
      dVar26 = dVar26 + 1.0;
      auVar40._8_8_ = dVar29;
      auVar34._8_8_ = dVar26;
      auVar34._0_8_ = local_c8;
      auVar32 = divpd(auVar40,auVar34);
      pdVar18[4] = dVar29;
      *(undefined1 (*) [16])(pdVar18 + 5) = auVar32;
      dVar26 = auVar32._0_8_ / dVar26;
    }
    else {
      dVar26 = (dVar31 / dVar27) / local_c8;
      pdVar18[4] = dVar31;
      pdVar18[5] = dVar26;
      pdVar18[6] = dVar31 / (pVVar14->P_dphe + 1.0);
      dVar26 = dVar26 / (pVVar14->P_dphe + 1.0);
    }
    pdVar18[7] = dVar26;
    if (dVar29 < ABS(pVVar14->s2_thr)) {
      lVar22 = 0;
      do {
        bVar5 = ValidityTests::nearlyEqual(pdVar18[lVar22],0.0,1e-09);
        pdVar18 = (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (bVar5) {
          pdVar18[lVar22] = 1e-06;
          dVar26 = 1e-06;
        }
        else {
          dVar26 = pdVar18[lVar22];
        }
        pdVar18[lVar22] = (double)((ulong)dVar26 | (ulong)DAT_00114240);
        lVar22 = lVar22 + 1;
      } while (lVar22 != 8);
    }
    pdVar18[8] = dStack_70;
  }
  return pvVar12;
}

Assistant:

const vector<double> &NESTcalc::GetS2(
    int Ne, double truthPosX, double truthPosY, double truthPosZ,
    double smearPosX, double smearPosY, double smearPosZ, double dt,
    double driftVelocity, uint64_t evtNum, double dfield,
    S2CalculationMode mode, int outputTiming, vector<int64_t> &wf_time,
    vector<double> &wf_amp, const vector<double> &g2_params) {
  double elYield = g2_params[0];
  double ExtEff = g2_params[1];
  double SE = g2_params[2];
  double g2 = g2_params[3];
  double gasGap = g2_params[4];

  std::fill(ionization.begin(), ionization.end(), 0);

  double subtract[2] = {0., 0.};
  int i;
  bool eTrain = false;
  if (mode == S2CalculationMode::WaveformWithEtrain &&
      !fdetector->get_inGas()) {
    eTrain = true;
  }

  if (dfield < FIELD_MIN  //"zero"-drift-field detector has no S2
      || elYield <= 0. || ExtEff <= 0. || SE <= 0. || g2 <= 0. ||
      gasGap <= 0.) {
    return ionization;
  }

  // Add some variability in g1_gas drawn from a polynomial spline fit
  double posDep =
      fdetector->FitS2(truthPosX, truthPosY,
                       VDetector::fold);  // XY is always in mm now, never cm
  double posDepSm;
  if (XYcorr == 2 || XYcorr == 3) {
    posDepSm = fdetector->FitS2(smearPosX, smearPosY, VDetector::unfold);
  } else {
    posDepSm = fdetector->FitS2(0, 0, VDetector::unfold);
  }
  posDep /= fdetector->FitS2(0., 0., VDetector::fold);
  posDepSm /= fdetector->FitS2(0., 0., VDetector::unfold);
  double dz = fdetector->get_TopDrift() - dt * driftVelocity;

  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 1.)) {
    posDep = 1.;
    posDepSm = 1.;
  }
  if (ValidityTests::nearlyEqual(fdetector->get_g1_gas(), 0.)) {
    posDep = 0.;
    posDepSm = 0.;
  }

  int Nee = RandomGen::rndm()->binom_draw(
      Ne, ExtEff * exp(-dt / fdetector->get_eLife_us()));
  // MAKE this 1 for SINGLE e- DEBUG

  uint64_t Nph = 0, nHits = 0, Nphe = 0;
  double pulseArea = 0.;

  if (mode == S2CalculationMode::Waveform ||
      mode == S2CalculationMode::WaveformWithEtrain) {
    uint64_t k;
    int stopPoint;
    double tau1, tau2, E_liq, amp2;
    vector<double> electronstream, AreaTableBot[2], AreaTableTop[2], TimeTable;
    if (eTrain) {
      stopPoint = RandomGen::rndm()->binom_draw(
          Ne, exp(-dt / fdetector->get_eLife_us()));
    } else {
      stopPoint = Nee;
    }
    electronstream.resize(stopPoint, dt);
    double elecTravT = 0., DL, DL_time, DT, phi, sigX, sigY, newX, newY;
    double Diff_Tran =
      GetDiffTran_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);
    double Diff_Long =
      GetDiffLong_Liquid(dfield, false, fdetector->get_T_Kelvin(), fdetector->get_p_bar(), DENSITY, ATOM_NUM);

    // a good rule of thumb but only for liquids, as gas kind of opposite:
    // Diff_Long ~ 0.15 * Diff_Tran, as it is in LAr, at least as field goes to
    // infinity
    double Diff_Long_Gas =
        4.265 + 19097. / (1e3 * fdetector->get_E_gas()) -
        1.7397e6 / pow(1e3 * fdetector->get_E_gas(), 2.) +
        1.2477e8 / pow(1e3 * fdetector->get_E_gas(), 3.);  // Nygren, NEXT
    double Diff_Tran_Gas = Diff_Tran * 0.01;
    if (fdetector->get_inGas()) {
      Diff_Tran *= 0.01;
      Diff_Long = 4.265 + 19097. / dfield - 1.7397e6 / pow(dfield, 2.) +
                  1.2477e8 / pow(dfield, 3.);
    }
    double sigmaDL =
        10. * sqrt(2. * Diff_Long * dt *
                   1e-6);  // sqrt of cm^2/s * s = cm; times 10 for mm.
    double sigmaDT = 10. * sqrt(2. * Diff_Tran * dt * 1e-6);
    bool YesGas = true;
    double rho = GetDensity(fdetector->get_T_Kelvin(), fdetector->get_p_bar(),
                            YesGas, 1, fdetector->get_molarMass());
    double driftVelocity_gas =
      GetDriftVelocity_MagBoltz(fdetector->get_T_Kelvin(), rho, fdetector->get_E_gas() * 1000., fdetector->get_p_bar(), fdetector->get_molarMass());
    double dt_gas = gasGap / driftVelocity_gas;
    double sigmaDLg = 10. * sqrt(2. * Diff_Long_Gas * dt_gas * 1e-6);
    double sigmaDTg = 10. * sqrt(2. * Diff_Tran_Gas * dt_gas * 1e-6);
    double tauTrap = 0.28326 + 5303/(dfield*dfield);  // microseconds, to match
    // LZ SR3, LUX Run03, Xe100/10. 0.185 (fixed) based on 1310.1117 (Gaussian)
    double min = 1e100;
    for (i = 0; i < stopPoint; ++i) {
      elecTravT = 0.;  // resetting for the current electron
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDL, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDT, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX = truthPosX + sigX;
      newY = truthPosY + sigY;
      if (newX * newX + newY * newY >
          fdetector->get_radmax() * fdetector->get_radmax()) {
        continue;  // remove electrons from outside the maximum possible radius
                   // (alternative is squeeze them, depending on your E-fields)
      }
      DL_time = DL / driftVelocity;
      elecTravT += DL_time;
      if (!fdetector->get_inGas() && fdetector->get_E_gas() != 0.) {
        elecTravT -= tauTrap * log(RandomGen::rndm()->rand_uniform());
      }
      electronstream[i] += elecTravT;
      SE = floor(RandomGen::rndm()->rand_gauss(
                     elYield, sqrt(fdetector->get_s2Fano() * elYield), true) +
                 0.5);
      Nph += uint64_t(SE);
      SE = (double)RandomGen::rndm()->binom_draw(
          uint64_t(SE), fdetector->get_g1_gas() * posDep);
      nHits += uint64_t(SE);
      double KE = 0.5 * 9.109e-31 * driftVelocity_gas * driftVelocity_gas *
                  1e6 / 1.602e-16;
      double origin = fdetector->get_TopDrift() + gasGap / 2.;
      QuantaResult quanta{};
      quanta.photons = int(SE);
      quanta.electrons = 0;
      quanta.ions = 0;
      quanta.excitons = int(floor(0.0566 * SE + 0.5));
      photonstream photon_emission_times = GetPhotonTimes(
          NEST::beta, quanta.photons, quanta.excitons, dfield, KE);
      photonstream photon_times =
          AddPhotonTransportTime(photon_emission_times, newX, newY, origin);
      SE += (double)RandomGen::rndm()->binom_draw(uint64_t(SE),
                                                  fdetector->get_P_dphe());
      Nphe += uint64_t(SE);
      DL = RandomGen::rndm()->rand_gauss(0., sigmaDLg, false);
      DT = std::abs(RandomGen::rndm()->rand_gauss(0., sigmaDTg, false));
      phi = two_PI * RandomGen::rndm()->rand_uniform();
      sigX = DT * cos(phi);
      sigY = DT * sin(phi);
      newX += sigX;
      newY += sigY;
      DL_time = DL / driftVelocity_gas;
      electronstream[i] += DL_time;
      if (i >= Nee && eTrain) {  // exponential based on arXiv:1711.07025, power
                                 // on 2004.07791
        E_liq = fdetector->get_E_gas() / (EPS_LIQ / std::abs(EPS_GAS));
        tau2 = (fdetector->get_TopDrift() /
                driftVelocity);  // 0.58313 * exp(0.20929 * E_liq) * 1e3;
        tau1 = 1.40540 * exp(0.15578 * E_liq) * 1e3 * 1e-2;
        amp2 = 0.38157 * exp(0.21177 * E_liq) * 1e-2;
        if (RandomGen::rndm()->rand_uniform() < (amp2 / 0.035) * ExtEff) {
          tau2 /= RandomGen::rndm()->rand_uniform();
          if (tau2 > 1e6) tau2 = 1e6;  // 1 sec. cap
          electronstream[i] += tau2;
        } else {
          electronstream[i] -= tau1 * log(RandomGen::rndm()->rand_uniform());
        }
      }
      for (double j = 0.; j < SE; j += 1.) {
        double phe = RandomGen::rndm()->rand_zero_trunc_gauss(
            1. / RandomGen::rndm()->FindNewMean(fdetector->get_sPEres()),
            fdetector->get_sPEres());
        if (i < Nee || !eTrain) pulseArea += phe;
        origin = fdetector->get_TopDrift() +
                 gasGap * RandomGen::rndm()->rand_uniform();
        k = uint64_t(j);
        if (k >= photon_times.size()) k -= photon_times.size();
        double offset = ((fdetector->get_anode() - origin) / driftVelocity_gas +
                         electronstream[i]) *
                            1e3 +
                        photon_times[k];
        if (offset < min) min = offset;
        if (RandomGen::rndm()->rand_uniform() <
            fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1]) {
          AreaTableBot[0].emplace_back(phe);
          AreaTableTop[0].emplace_back(0.0);
        } else {
          AreaTableBot[0].emplace_back(0.0);
          AreaTableTop[0].emplace_back(phe);
        }
        TimeTable.emplace_back(offset);
      }
    }
    int numPts = Nphe * 1000;
    if (numPts < 1000 / SAMPLE_SIZE) numPts = 1000 / SAMPLE_SIZE;
    AreaTableBot[1].resize(numPts, 0.);
    AreaTableTop[1].resize(numPts, 0.);
    min -= 5. * SAMPLE_SIZE;
    for (k = 0; k < Nphe; ++k) {
      vector<double> PEperBin;
      if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableTop[0][k], TimeTable[k] - min);
      else {
        PEperBin =
            fdetector->SinglePEWaveForm(AreaTableBot[0][k], TimeTable[k] - min);
      }
      for (i = 0; i < int(PEperBin.size()) - 1; ++i) {
        double eTime = PEperBin[0] + i * SAMPLE_SIZE;
        int index = int(floor(eTime / SAMPLE_SIZE + 0.5));
        index = NESTcalc::clamp(index, 0, numPts - 1);
        if (ValidityTests::nearlyEqual(AreaTableBot[0][k], 0.0))
          AreaTableTop[1][index] += 10. * AreaTableTop[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        else {
          AreaTableBot[1][index] += 10. * AreaTableBot[0][k] /
                                    (PULSE_WIDTH * sqrt2_PI) *
                                    exp(-pow(eTime - TimeTable[k] + min, 2.) /
                                        (2. * PULSE_WIDTH * PULSE_WIDTH));
        }
      }
    }
    for (k = 0; k < numPts; ++k) {
      if ((AreaTableBot[1][k] + AreaTableTop[1][k]) <= PULSEHEIGHT) continue;
      wf_time.emplace_back(k * SAMPLE_SIZE + int64_t(min + SAMPLE_SIZE / 2.));
      wf_amp.emplace_back(AreaTableBot[1][k] + AreaTableTop[1][k]);

      if (outputTiming >= 0) {
        char line[80];
        if (AreaTableBot[1][k] > PHE_MAX)
          subtract[0] = AreaTableBot[1][k] - PHE_MAX;
        else {
          subtract[0] = 0.0;
        }
        if (AreaTableTop[1][k] > PHE_MAX)
          subtract[1] = AreaTableTop[1][k] - PHE_MAX;
        else {
          subtract[1] = 0.0;
        }
        snprintf(line, 80, "%llu\t%lld\t%.3f\t%.3f",
                 (long long unsigned int)evtNum, (long long int)wf_time.back(),
                 AreaTableBot[1][k] - subtract[0],
                 AreaTableTop[1][k] - subtract[1]);
        pulseFile << line << endl;
      }
    }
  } else {
    Nph = uint64_t(
        floor(RandomGen::rndm()->rand_gauss(
                  elYield * double(Nee),
                  sqrt(fdetector->get_s2Fano() * elYield * double(Nee)), true) +
              0.5));
    nHits =
        RandomGen::rndm()->binom_draw(Nph, fdetector->get_g1_gas() * posDep);
    Nphe =
        nHits + RandomGen::rndm()->binom_draw(nHits, fdetector->get_P_dphe());
    double NewMean = RandomGen::rndm()->FindNewMean(fdetector->get_sPEres());
    pulseArea = RandomGen::rndm()->rand_gauss(
        Nphe / NewMean, fdetector->get_sPEres() * sqrt(Nphe / NewMean), true);
  }

  if (fdetector->get_noiseLinear()[1] >= 1.0)
    cerr << " !!WARNING!! S2 linear noise term is greater than or equal to 100% "
            "(i.e. 1.0) Did you mistake fraction for percent??"
         << endl;
  if (fdetector->get_noiseQuadratic()[1] != 0) {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea,
        sqrt(pow(fdetector->get_noiseQuadratic()[1] * pow(pulseArea, 2), 2) +
             pow(fdetector->get_noiseLinear()[1] * pulseArea, 2)),
        true);
  } else {
    pulseArea = RandomGen::rndm()->rand_gauss(
        pulseArea, fdetector->get_noiseLinear()[1] * pulseArea, true);
  }
  pulseArea -= (subtract[0] + subtract[1]);
  double pulseAreaC =
      pulseArea / exp(-dt / fdetector->get_eLife_us()) / posDepSm;
  double Nphd = pulseArea / (1. + fdetector->get_P_dphe());
  double NphdC = pulseAreaC / (1. + fdetector->get_P_dphe());

  double S2b = RandomGen::rndm()->rand_gauss(
      fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea,
      sqrt(fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1] * pulseArea *
           (1. - fdetector->FitTBA(truthPosX, truthPosY, truthPosZ)[1])),
      true);
  double S2bc =
      S2b / exp(-dt / fdetector->get_eLife_us()) /
      posDepSm;  // for detectors using S2 bottom-only in their analyses

  ionization[0] = Nee;  // integer number of electrons unabsorbed in liquid then
  // getting extracted
  ionization[1] = Nph;    // raw number of photons produced in the gas gap
  ionization[2] = nHits;  // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  ionization[3] = Nphe;  // MC-true integer hits WITH double phe effect (Nphe >
  // nHits). S2 has more steps than S1 (e's 1st)
  if (fdetector->get_s2_thr() >= 0) {
    ionization[4] = pulseArea;  // floating real# smeared DAQ pulse areas in
    // phe, NO XYZ correction
    ionization[5] =
        pulseAreaC;  // smeared DAQ pulse areas in phe, WITH XYZ correction
    ionization[6] = Nphd;  // same as pulse area, adjusted/corrected *downward*
    // for 2-PE effect (LUX phd units)
    ionization[7] = NphdC;  // same as Nphd, but XYZ-corrected
  }
  // Negative S2 threshold is a hidden feature, which switches from S2 -> S2
  // bottom (NOT literally negative)
  else {
    ionization[4] = S2b;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, NO XYZ correction
    ionization[5] = S2bc;  // floating real# smeared pulse areas in phe ONLY
    // including bottom PMTs, WITH XYZ correction
    ionization[6] =
        S2b / (1. + fdetector->get_P_dphe());  // same as S2b, but adjusted for
    // 2-PE effect (LUX phd units)
    ionization[7] = S2bc / (1. + fdetector->get_P_dphe());  // same as S2bc, but
                                                            // adjusted for 2-PE
                                                            // effect (LUX phd
                                                            // units)
  }

  if (pulseArea < std::abs(fdetector->get_s2_thr())) {
    for (i = 0; i < 8; ++i) {
      if (ValidityTests::nearlyEqual(ionization[i], 0.))
        ionization[i] = PHE_MIN;
      ionization[i] = -1. * std::abs(ionization[i]);
    }
  }

  ionization[8] =
      g2;  // g2 = ExtEff * SE, gain of EL in gas gap (from CalculateG2)

  return ionization;
}